

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint32_t assess_se_option(aec_stream *strm)

{
  uint32_t *puVar1;
  uint64_t d;
  size_t i;
  uint64_t len;
  uint32_t *block;
  internal_state *state;
  aec_stream *strm_local;
  
  puVar1 = strm->state->block;
  len = 1;
  i = 0;
  while( true ) {
    if (strm->block_size <= i) {
      return (uint32_t)len;
    }
    len = (((ulong)puVar1[i] + (ulong)puVar1[i + 1]) * ((ulong)puVar1[i] + (ulong)puVar1[i + 1] + 1)
          >> 1) + (ulong)puVar1[i + 1] + 1 + len;
    if (strm->state->uncomp_len < len) break;
    i = i + 2;
  }
  return 0xffffffff;
}

Assistant:

static uint32_t assess_se_option(struct aec_stream *strm)
{
    /**
       Length of CDS encoded with Second Extension option.

       If length is above limit just return UINT32_MAX.
    */

    struct internal_state *state = strm->state;
    uint32_t *block = state->block;
    uint64_t len = 1;

    for (size_t i = 0; i < strm->block_size; i += 2) {
        uint64_t d = (uint64_t)block[i] + (uint64_t)block[i + 1];
        len += d * (d + 1) / 2 + block[i + 1] + 1;
        if (len > state->uncomp_len)
            return UINT32_MAX;
    }
    return (uint32_t)len;
}